

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

void __thiscall vectorgraphics::TikzPlotter::addPolygon(TikzPlotter *this,Polygon2D *polygon_2d)

{
  undefined1 *out;
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  Style *this_00;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  shared_ptr<vectorgraphics::Point2D> *point_ptr;
  pointer psVar8;
  long lVar9;
  pointer psVar10;
  pointer psVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_1c9;
  allocator<char> local_1c8;
  allocator_type local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  Polygon2D *local_1c0;
  TikzPlotter *local_1b8;
  key_type local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  StyleMap style_map;
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_148;
  key_type local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &style_map._M_t._M_impl.super__Rb_tree_header._M_header;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  style_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = (polygon_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = polygon_2d;
  local_1b8 = this;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (psVar8 = (polygon_2d->super_Primitive).style_ptrs.
                super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar2; psVar8 = psVar8 + 1) {
    this_00 = (psVar8->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::vector(&local_148,
             (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
              *)local_1c0);
    bVar5 = Style::conditionFulfilled(this_00,&local_148);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::~vector(&local_148);
    if (bVar5) {
      Style::applyStyle((psVar8->
                        super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,&style_map);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"draw",&local_1c8);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&style_map._M_t,&local_130);
  p_Var1 = &style_map._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"fill",&local_1c9);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&style_map._M_t,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_130);
    if ((_Rb_tree_header *)iVar6._M_node == p_Var1) goto LAB_001051f6;
  }
  else {
    std::__cxx11::string::~string((string *)&local_130);
  }
  out = &local_1b8->field_0x10;
  poVar7 = std::operator<<((ostream *)out,"\\path[");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"draw",&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"draw opacity",&local_1c9);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"fill",&local_1c1);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"fill opacity",&local_1c2);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"line width",&local_1c3);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"line cap",&local_1c4);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"dash pattern",&local_1c5);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"*polygon_path",&local_1c6);
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_190,__l,&local_1c7);
  getStyleMapString(&local_1b0,&style_map,&local_190);
  poVar7 = std::operator<<(poVar7,(string *)&local_1b0);
  std::operator<<(poVar7,"] ");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  lVar9 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  psVar3 = (local_1c0->point_ptrs_).
           super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (local_1c0->point_ptrs_).
                 super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar3; psVar10 = psVar10 + 1
      ) {
    poVar7 = operator<<((ostream *)out,
                        (psVar10->
                        super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    std::operator<<(poVar7,"-- ");
  }
  poVar7 = std::operator<<((ostream *)out,"cycle;");
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_001051f6:
  psVar4 = (local_1c0->line_segment_ptrs_).
           super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (local_1c0->line_segment_ptrs_).
                 super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar4; psVar11 = psVar11 + 1
      ) {
    addLineSegment(local_1b8,
                   (psVar11->
                   super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&style_map._M_t);
  return;
}

Assistant:

void TikzPlotter::addPolygon(const Polygon2D &polygon_2d) {
    // first add the polygon
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : polygon_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(polygon_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the polygon based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "line cap", "dash pattern", "*polygon_path"})
        << "] ";
      
      for(const auto& point_ptr : polygon_2d.point_ptrs_) 
        content << *point_ptr << "-- ";

      content << "cycle;"
        << std::endl;
    }

    // and then the outline
      for(const auto& line_segment_ptr : polygon_2d.line_segment_ptrs_)
        addLineSegment(*line_segment_ptr);
  }